

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

int __thiscall CImage::LoadTga(CImage *this,char *szFilename)

{
  uchar uVar1;
  uchar uVar2;
  int iVar3;
  FILE *pFVar4;
  size_t sVar5;
  undefined4 local_474;
  uchar *puStack_470;
  _BGRA colCur_2;
  _BGRA *pcolBuf_2;
  uchar *puStack_460;
  _BGR colCur_1;
  _BGR *pcolBuf_1;
  uchar *puStack_450;
  uchar colCur;
  uchar *pcolBuf;
  uchar BmpPal [256] [4];
  int local_40;
  bool bCompressed;
  int iStack_3c;
  uchar nCount;
  int k;
  int j;
  int i;
  char local_2b;
  _TGAHEADER fh;
  char *szFilename_local;
  CImage *this_local;
  
  fh._10_8_ = szFilename;
  pFVar4 = fopen(szFilename,"rb");
  this->f = (FILE *)pFVar4;
  if (pFVar4 == (FILE *)0x0) {
    this_local._4_4_ = 0x32;
  }
  else {
    sVar5 = fread((void *)((long)&j + 2),0x12,1,(FILE *)this->f);
    if (sVar5 == 1) {
      BmpPal[0xff][2] = ((byte)i & 8) != 0;
      if (((byte)fh.tiX0 == 0) || (0x20 < (byte)fh.tiX0)) {
        this_local._4_4_ = 0x34;
      }
      else {
        iVar3 = Init(this,(uint)(ushort)fh._4_2_,(uint)(ushort)fh._6_2_,(ushort)(byte)fh.tiX0);
        if (iVar3 == 0) {
          if (this->m_BitPerPixel == 8) {
            if (j._3_1_ == '\x01') {
              if (local_2b == '\x18') {
                sVar5 = fread(this->m_Pal,3,(ulong)stack0xffffffffffffffd3,(FILE *)this->f);
                if (sVar5 != stack0xffffffffffffffd3) {
                  return 0x33;
                }
              }
              else if (local_2b == ' ') {
                sVar5 = fread(&pcolBuf,4,(ulong)stack0xffffffffffffffd3,(FILE *)this->f);
                if (sVar5 != stack0xffffffffffffffd3) {
                  return 0x33;
                }
                for (k = 0; k < (int)(uint)stack0xffffffffffffffd3; k = k + 1) {
                  this->m_Pal[k].b = BmpPal[(long)k + -2][0];
                  this->m_Pal[k].g = BmpPal[(long)k + -2][1];
                  this->m_Pal[k].r = BmpPal[(long)k + -2][2];
                }
              }
            }
            else {
              for (k = 0; k < 0x100; k = k + 1) {
                uVar1 = (uchar)k;
                this->m_Pal[k].r = uVar1;
                this->m_Pal[k].g = uVar1;
                this->m_Pal[k].b = uVar1;
              }
            }
            puStack_450 = this->m_pBitmap + this->m_NumPixel;
            if ((BmpPal[0xff][2] & 1) == 0) {
              for (iStack_3c = 0; iStack_3c < this->m_Yres; iStack_3c = iStack_3c + 1) {
                puStack_450 = puStack_450 + -(long)this->m_Xres;
                sVar5 = fread(puStack_450,1,(long)this->m_Xres,(FILE *)this->f);
                if (sVar5 != (long)this->m_Xres) {
                  return 0x33;
                }
              }
            }
            else {
              puStack_450 = puStack_450 + -(long)this->m_Xres;
              k = 0;
              this->m_nCount = 0x8000;
LAB_004625a8:
              if (this->m_pBitmap <= puStack_450) {
                BmpPal[0xff][3] = Input(this);
                if ((BmpPal[0xff][3] & 0x80) == 0) {
                  for (local_40 = 0; local_40 <= (int)(uint)BmpPal[0xff][3]; local_40 = local_40 + 1
                      ) {
                    uVar1 = Input(this);
                    puStack_450[k] = uVar1;
                    k = k + 1;
                    if (k == this->m_Xres) {
                      k = 0;
                      puStack_450 = puStack_450 + -(long)this->m_Xres;
                      break;
                    }
                  }
                }
                else {
                  uVar1 = Input(this);
                  for (local_40 = 0; local_40 <= (int)(BmpPal[0xff][3] - 0x80);
                      local_40 = local_40 + 1) {
                    puStack_450[k] = uVar1;
                    k = k + 1;
                    if (k == this->m_Xres) {
                      k = 0;
                      puStack_450 = puStack_450 + -(long)this->m_Xres;
                      break;
                    }
                  }
                }
                goto LAB_004625a8;
              }
            }
          }
          else if (this->m_BitPerPixel == 0x18) {
            puStack_460 = this->m_pBitmap + (long)this->m_NumPixel * 3;
            if ((BmpPal[0xff][2] & 1) == 0) {
              for (iStack_3c = 0; iStack_3c < this->m_Yres; iStack_3c = iStack_3c + 1) {
                puStack_460 = puStack_460 + (long)this->m_Xres * -3;
                sVar5 = fread(puStack_460,3,(long)this->m_Xres,(FILE *)this->f);
                if (sVar5 != (long)this->m_Xres) {
                  return 0x33;
                }
              }
            }
            else {
              puStack_460 = puStack_460 + (long)this->m_Xres * -3;
              k = 0;
              this->m_nCount = 0x8000;
LAB_0046280f:
              if (this->m_pBitmap <= puStack_460) {
                BmpPal[0xff][3] = Input(this);
                if ((BmpPal[0xff][3] & 0x80) == 0) {
                  for (local_40 = 0; local_40 <= (int)(uint)BmpPal[0xff][3]; local_40 = local_40 + 1
                      ) {
                    uVar1 = Input(this);
                    uVar2 = Input(this);
                    pcolBuf_2._5_2_ = CONCAT11(uVar2,uVar1);
                    uVar1 = Input(this);
                    *(undefined2 *)(puStack_460 + (long)k * 3) = pcolBuf_2._5_2_;
                    (puStack_460 + (long)k * 3)[2] = uVar1;
                    k = k + 1;
                    if (k == this->m_Xres) {
                      k = 0;
                      puStack_460 = puStack_460 + (long)this->m_Xres * -3;
                      break;
                    }
                  }
                }
                else {
                  uVar1 = Input(this);
                  uVar2 = Input(this);
                  pcolBuf_2._5_2_ = CONCAT11(uVar2,uVar1);
                  uVar1 = Input(this);
                  for (local_40 = 0; local_40 <= (int)(BmpPal[0xff][3] - 0x80);
                      local_40 = local_40 + 1) {
                    *(undefined2 *)(puStack_460 + (long)k * 3) = pcolBuf_2._5_2_;
                    (puStack_460 + (long)k * 3)[2] = uVar1;
                    k = k + 1;
                    if (k == this->m_Xres) {
                      k = 0;
                      puStack_460 = puStack_460 + (long)this->m_Xres * -3;
                      break;
                    }
                  }
                }
                goto LAB_0046280f;
              }
            }
          }
          else {
            if (this->m_BitPerPixel != 0x20) {
              return 0x36;
            }
            puStack_470 = this->m_pBitmap + (long)this->m_NumPixel * 4;
            if ((BmpPal[0xff][2] & 1) == 0) {
              for (iStack_3c = 0; iStack_3c < this->m_Yres; iStack_3c = iStack_3c + 1) {
                puStack_470 = puStack_470 + (long)this->m_Xres * -4;
                sVar5 = fread(puStack_470,4,(long)this->m_Xres,(FILE *)this->f);
                if (sVar5 != (long)this->m_Xres) {
                  return 0x33;
                }
              }
            }
            else {
              puStack_470 = puStack_470 + (long)this->m_Xres * -4;
              k = 0;
              this->m_nCount = 0x8000;
LAB_00462aee:
              if (this->m_pBitmap <= puStack_470) {
                BmpPal[0xff][3] = Input(this);
                if ((BmpPal[0xff][3] & 0x80) == 0) {
                  for (local_40 = 0; local_40 <= (int)(uint)BmpPal[0xff][3]; local_40 = local_40 + 1
                      ) {
                    uVar1 = Input(this);
                    uVar2 = Input(this);
                    local_474._0_2_ = CONCAT11(uVar2,uVar1);
                    uVar1 = Input(this);
                    local_474._0_3_ = CONCAT12(uVar1,(undefined2)local_474);
                    uVar1 = Input(this);
                    local_474 = CONCAT13(uVar1,(undefined3)local_474);
                    *(undefined4 *)(puStack_470 + (long)k * 4) = local_474;
                    k = k + 1;
                    if (k == this->m_Xres) {
                      k = 0;
                      puStack_470 = puStack_470 + (long)this->m_Xres * -4;
                      break;
                    }
                  }
                }
                else {
                  uVar1 = Input(this);
                  uVar2 = Input(this);
                  local_474._0_2_ = CONCAT11(uVar2,uVar1);
                  uVar1 = Input(this);
                  local_474._0_3_ = CONCAT12(uVar1,(undefined2)local_474);
                  uVar1 = Input(this);
                  local_474 = CONCAT13(uVar1,(undefined3)local_474);
                  for (local_40 = 0; local_40 <= (int)(BmpPal[0xff][3] - 0x80);
                      local_40 = local_40 + 1) {
                    *(undefined4 *)(puStack_470 + (long)k * 4) = local_474;
                    k = k + 1;
                    if (k == this->m_Xres) {
                      k = 0;
                      puStack_470 = puStack_470 + (long)this->m_Xres * -4;
                      break;
                    }
                  }
                }
                goto LAB_00462aee;
              }
            }
          }
          fclose((FILE *)this->f);
          this_local._4_4_ = 0;
        }
        else {
          this_local._4_4_ = 0x35;
        }
      }
    }
    else {
      this_local._4_4_ = 0x33;
    }
  }
  return this_local._4_4_;
}

Assistant:

int CImage::LoadTga(char *szFilename)
{
  _TGAHEADER      fh;
  int             i, j, k;
  unsigned char   nCount;

  if (!(f = fopen(szFilename, "rb"))) return eLoadTgaFileOpen;
  if (fread(&fh, sizeof(fh), 1, f) != 1) return eLoadTgaFileRead;
  bool bCompressed = (( fh.tiImageType & 8 ) != 0);
  if ((fh.tiBitPerPixel<=0) || (fh.tiBitPerPixel>32))
    return eLoadTgaBadFormat;

  if ( Init( fh.tiXres, fh.tiYres, fh.tiBitPerPixel ) != 0 ) 
    return eLoadTgaInit;

  if ( m_BitPerPixel == 8 )
  {
    if ( fh.tiPaletteIncluded == 1 )
    {
      if ( fh.tiPaletteBpp == 24)
      {
        if (fread(&m_Pal, 3, fh.tiPaletteSize, f) != fh.tiPaletteSize) 
          return eLoadTgaFileRead;
      }
      else
      if ( fh.tiPaletteBpp == 32)
      {
        unsigned char BmpPal[256][4];

        if (fread(&BmpPal, 4, fh.tiPaletteSize, f) != fh.tiPaletteSize) 
          return eLoadTgaFileRead;

        for (i=0; i<fh.tiPaletteSize; i++)
        {
          m_Pal[i].b = BmpPal[i][0];
          m_Pal[i].g = BmpPal[i][1];
          m_Pal[i].r = BmpPal[i][2];
        }
      }
    }
    else
    {
      for (i=0; i<256; i++)
      {
        m_Pal[i].r = i;
        m_Pal[i].g = i;
        m_Pal[i].b = i;
      }
    }

    unsigned char * pcolBuf = m_pBitmap;
    pcolBuf += m_NumPixel;

    if ( !bCompressed )
    {
      for (j=0; j<m_Yres; j++)
      {
        pcolBuf -= m_Xres;
        if (fread(pcolBuf, 1, m_Xres, f) != (size_t)m_Xres) 
          return eLoadTgaFileRead;
      }
    }
    else
    {
      unsigned char colCur;

      pcolBuf -= m_Xres;

      i = 0;
      m_nCount = sizeof(m_cBuf);

      while ( pcolBuf >= m_pBitmap )
      {
        nCount = Input();
        if ((nCount & 128)==0)
        {
          for (k=0; k<=nCount; k++)
          {
            colCur = Input();
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
        else
        {
          colCur = Input();
          for (k=0; k<=nCount-128; k++)
          {
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
      }
    }
  }
  else
  if ( m_BitPerPixel == 24 )
  {
    _BGR * pcolBuf = (_BGR *)m_pBitmap;
    pcolBuf += m_NumPixel;

    if ( !bCompressed )
    {
      for (j=0; j<m_Yres; j++)
      {
        pcolBuf -= m_Xres;
        if (fread(pcolBuf, sizeof(_BGR), m_Xres, f) != (size_t)m_Xres) 
          return eLoadTgaFileRead;
      }
    }
    else
    {
      _BGR colCur;

      pcolBuf -= m_Xres;

      i = 0;
      m_nCount = sizeof(m_cBuf);

      while ( pcolBuf >= (_BGR *)m_pBitmap )
      {
        nCount = Input();
        if ((nCount & 128)==0)
        {
          for (k=0; k<=nCount; k++)
          {
            colCur.b = Input();
            colCur.g = Input();
            colCur.r = Input();
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
        else
        {
          colCur.b = Input();
          colCur.g = Input();
          colCur.r = Input();
          for (k=0; k<=nCount-128; k++)
          {
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
      }
    }
  }
  else
  if ( m_BitPerPixel == 32 )
  {
    _BGRA * pcolBuf = (_BGRA *)m_pBitmap;
    pcolBuf += m_NumPixel;

    if ( !bCompressed )
    {
      for (j=0; j<m_Yres; j++)
      {
        pcolBuf -= m_Xres;
        if (fread(pcolBuf, sizeof(_BGRA), m_Xres, f) != (size_t)m_Xres) 
          return eLoadTgaFileRead;
      }
    }
    else
    {
      _BGRA colCur;

      pcolBuf -= m_Xres;

      i = 0;
      m_nCount = sizeof(m_cBuf);

      while ( pcolBuf >= (_BGRA *)m_pBitmap )
      {
        nCount = Input();
        if ((nCount & 128)==0)
        {
          for (k=0; k<=nCount; k++)
          {
            colCur.b = Input();
            colCur.g = Input();
            colCur.r = Input();
            colCur.a = Input();
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
        else
        {
          colCur.b = Input();
          colCur.g = Input();
          colCur.r = Input();
          colCur.a = Input();
          for (k=0; k<=nCount-128; k++)
          {
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
      }
    }
  }
  else 
    return eLoadTgaColorDepth;

  fclose(f);

  return 0;
}